

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O1

bool __thiscall SQClass::Get(SQClass *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQClassMember *pSVar3;
  bool bVar4;
  uint uVar5;
  SQObjectType SVar6;
  ulong uVar7;
  uint uVar8;
  SQObjectType *pSVar9;
  SQObjectType *pSVar10;
  SQTable *pSVar11;
  
  bVar4 = SQTable::Get(this->_members,key,val);
  if (bVar4) {
    uVar8 = SUB84((val->super_SQObject)._unVal,0);
    uVar5 = uVar8 & 0xffffff;
    if ((uVar8 >> 0x19 & 1) == 0) {
      pSVar3 = (this->_methods)._vals;
      uVar7 = (ulong)(uVar5 << 5);
      SVar2 = (val->super_SQObject)._type;
      pSVar11 = (val->super_SQObject)._unVal.pTable;
      (val->super_SQObject)._unVal =
           *(SQObjectValue *)((long)&(pSVar3->val).super_SQObject._unVal + uVar7);
      SVar6 = *(SQObjectType *)((long)&(pSVar3->val).super_SQObject._type + uVar7);
    }
    else {
      pSVar9 = (SQObjectType *)
               ((long)&(((this->_defaultvalues)._vals)->val).super_SQObject._type +
               (ulong)(uVar5 << 5));
      pSVar10 = pSVar9 + 2;
      SVar6 = *pSVar9;
      if (SVar6 == OT_WEAKREF) {
        SVar6 = *(SQObjectType *)(*(undefined8 *)pSVar10 + 0x18);
        pSVar10 = (SQObjectType *)(*(undefined8 *)pSVar10 + 0x20);
      }
      SVar2 = (val->super_SQObject)._type;
      pSVar11 = (val->super_SQObject)._unVal.pTable;
      (val->super_SQObject)._unVal.pWeakRef = *(SQWeakRef **)pSVar10;
    }
    (val->super_SQObject)._type = SVar6;
    if ((SVar6 >> 0x1b & 1) != 0) {
      pSVar1 = &(((val->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar4;
}

Assistant:

bool Get(const SQObjectPtr &key,SQObjectPtr &val) {
        if(_members->Get(key,val)) {
            if(_isfield(val)) {
                SQObjectPtr &o = _defaultvalues[_member_idx(val)].val;
                val = _realval(o);
            }
            else {
                val = _methods[_member_idx(val)].val;
            }
            return true;
        }
        return false;
    }